

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::clear_memo_foreach_action(search_private *priv)

{
  v_array<Search::action_cache> **ppvVar1;
  v_array<Search::action_cache> *this;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0; ppvVar1 = (priv->memo_foreach_action)._begin,
      uVar2 < (ulong)((long)(priv->memo_foreach_action)._end - (long)ppvVar1 >> 3);
      uVar2 = uVar2 + 1) {
    this = ppvVar1[uVar2];
    if (this != (v_array<Search::action_cache> *)0x0) {
      v_array<Search::action_cache>::delete_v(this);
      operator_delete((priv->memo_foreach_action)._begin[uVar2]);
    }
  }
  v_array<v_array<Search::action_cache>_*>::clear(&priv->memo_foreach_action);
  return;
}

Assistant:

void clear_memo_foreach_action(search_private& priv)
{
  for (size_t i = 0; i < priv.memo_foreach_action.size(); i++)
    if (priv.memo_foreach_action[i])
    {
      priv.memo_foreach_action[i]->delete_v();
      delete priv.memo_foreach_action[i];
    }
  priv.memo_foreach_action.clear();
}